

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O1

void helper_crypto_sm3partw1_arm(void *vd,void *vn,void *vm)

{
  uint uVar1;
  ulong uVar2;
  uint64_t *rm;
  uint uVar3;
  uint64_t *rn;
  uint uVar4;
  uint uVar5;
  
  uVar4 = (*(uint *)((long)vm + 4) << 0xf | *(uint *)((long)vm + 4) >> 0x11) ^ (uint)(*vn ^ *vd);
  uVar4 = (uVar4 << 0x17 | uVar4 >> 9) ^ (uVar4 << 0xf | uVar4 >> 0x11) ^ uVar4;
  uVar1 = (uint)*(undefined8 *)((long)vm + 8);
  uVar5 = (uVar1 << 0xf | uVar1 >> 0x11) ^ (uint)((*vn ^ *vd) >> 0x20);
  uVar2 = *(ulong *)((long)vn + 8) ^ *(ulong *)((long)vd + 8);
  uVar1 = (uint)((ulong)*(undefined8 *)((long)vm + 8) >> 0x20);
  uVar3 = (uVar1 << 0xf | uVar1 >> 0x11) ^ (uint)uVar2;
  uVar1 = (uVar4 << 0xf | uVar4 >> 0x11) ^ (uint)(uVar2 >> 0x20);
  *(ulong *)vd = CONCAT44((uVar5 << 0x17 | uVar5 >> 9) ^ (uVar5 << 0xf | uVar5 >> 0x11) ^ uVar5,
                          uVar4);
  *(ulong *)((long)vd + 8) =
       CONCAT44((uVar1 << 0x17 | uVar1 >> 9) ^ (uVar1 << 0xf | uVar1 >> 0x11) ^ uVar1,
                (uVar3 << 0x17 | uVar3 >> 9) ^ (uVar3 << 0xf | uVar3 >> 0x11) ^ uVar3);
  return;
}

Assistant:

void HELPER(crypto_sm3partw1)(void *vd, void *vn, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };
    uint32_t t;

    t = CR_ST_WORD(d, 0) ^ CR_ST_WORD(n, 0) ^ ror32(CR_ST_WORD(m, 1), 17);
    CR_ST_WORD(d, 0) = t ^ ror32(t, 17) ^ ror32(t, 9);

    t = CR_ST_WORD(d, 1) ^ CR_ST_WORD(n, 1) ^ ror32(CR_ST_WORD(m, 2), 17);
    CR_ST_WORD(d, 1) = t ^ ror32(t, 17) ^ ror32(t, 9);

    t = CR_ST_WORD(d, 2) ^ CR_ST_WORD(n, 2) ^ ror32(CR_ST_WORD(m, 3), 17);
    CR_ST_WORD(d, 2) = t ^ ror32(t, 17) ^ ror32(t, 9);

    t = CR_ST_WORD(d, 3) ^ CR_ST_WORD(n, 3) ^ ror32(CR_ST_WORD(d, 0), 17);
    CR_ST_WORD(d, 3) = t ^ ror32(t, 17) ^ ror32(t, 9);

    rd[0] = d.l[0];
    rd[1] = d.l[1];
}